

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall Minisat::StringOption::printOptionCall(StringOption *this,stringstream *s)

{
  string *psVar1;
  ostream *poVar2;
  
  psVar1 = this->value;
  poVar2 = std::operator<<((ostream *)(s + 0x10),"-");
  poVar2 = std::operator<<(poVar2,(this->super_Option).name);
  if (psVar1 != (string *)0x0) {
    poVar2 = std::operator<<(poVar2,"=");
    std::operator<<(poVar2,(string *)this->value);
    return;
  }
  std::operator<<(poVar2,"=\"\"");
  return;
}

Assistant:

virtual void printOptionCall(std::stringstream &s)
    {
        if (value != NULL) {
            s << "-" << name << "=" << *value;
        } else {
            s << "-" << name << "=\"\"";
        }
    }